

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
absl::Mul32(absl *this,pair<unsigned_long,_unsigned_long> num,uint32_t mul)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  
  uVar8 = (ulong)(uint)num.second;
  uVar4 = (num.first & 0xffffffff) * uVar8;
  uVar2 = (num.first >> 0x20) * uVar8;
  uVar7 = ((ulong)this & 0xffffffff) * uVar8;
  uVar8 = ((ulong)this >> 0x20) * uVar8;
  uVar5 = uVar2 << 0x20;
  uVar6 = uVar5 + uVar4;
  uVar2 = (uVar2 >> 0x20) + (uVar8 << 0x20) + uVar7 + (ulong)CARRY8(uVar5,uVar4);
  uVar4 = (uVar8 >> 0x20) + (ulong)(uVar2 < uVar7);
  if (uVar4 != 0) {
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    bVar9 = -((byte)lVar1 ^ 0x3f);
    bVar3 = ~(byte)lVar1;
    uVar6 = (uVar6 >> (bVar9 & 0x3f)) + (uVar2 << (bVar3 & 0x3f));
    uVar2 = (uVar2 >> (bVar9 & 0x3f)) + (uVar4 << (bVar3 & 0x3f));
  }
  pVar10.second = uVar6;
  pVar10.first = uVar2;
  return pVar10;
}

Assistant:

static std::pair<uint64_t, uint64_t> Mul32(std::pair<uint64_t, uint64_t> num,
                                           uint32_t mul) {
  uint64_t bits0_31 = num.second & 0xFFFFFFFF;
  uint64_t bits32_63 = num.second >> 32;
  uint64_t bits64_95 = num.first & 0xFFFFFFFF;
  uint64_t bits96_127 = num.first >> 32;

  // The picture so far: each of these 64-bit values has only the lower 32 bits
  // filled in.
  // bits96_127:          [ 00000000 xxxxxxxx ]
  // bits64_95:                    [ 00000000 xxxxxxxx ]
  // bits32_63:                             [ 00000000 xxxxxxxx ]
  // bits0_31:                                       [ 00000000 xxxxxxxx ]

  bits0_31 *= mul;
  bits32_63 *= mul;
  bits64_95 *= mul;
  bits96_127 *= mul;

  // Now the top halves may also have value, though all 64 of their bits will
  // never be set at the same time, since they are a result of a 32x32 bit
  // multiply.  This makes the carry calculation slightly easier.
  // bits96_127:          [ mmmmmmmm | mmmmmmmm ]
  // bits64_95:                    [ | mmmmmmmm mmmmmmmm | ]
  // bits32_63:                      |        [ mmmmmmmm | mmmmmmmm ]
  // bits0_31:                       |                 [ | mmmmmmmm mmmmmmmm ]
  // eventually:        [ bits128_up | ...bits64_127.... | ..bits0_63... ]

  uint64_t bits0_63 = bits0_31 + (bits32_63 << 32);
  uint64_t bits64_127 = bits64_95 + (bits96_127 << 32) + (bits32_63 >> 32) +
                        (bits0_63 < bits0_31);
  uint64_t bits128_up = (bits96_127 >> 32) + (bits64_127 < bits64_95);
  if (bits128_up == 0) return {bits64_127, bits0_63};

  auto shift = static_cast<unsigned>(bit_width(bits128_up));
  uint64_t lo = (bits0_63 >> shift) + (bits64_127 << (64 - shift));
  uint64_t hi = (bits64_127 >> shift) + (bits128_up << (64 - shift));
  return {hi, lo};
}